

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgio.c
# Opt level: O3

int buf_send(int sock,void *buf,size_t size)

{
  ssize_t sVar1;
  int *piVar2;
  fd_set *__arr;
  fd_set local_b8;
  
  if (sock < 0) {
    __assert_fail("sock >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                  ,0x1ae,"int buf_send(int, void *, size_t)");
  }
  if (size != 0) {
    if (buf == (void *)0x0) {
      __assert_fail("buf != ((void*)0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                    ,0x1b0,"int buf_send(int, void *, size_t)");
    }
    do {
      local_b8.fds_bits[0xe] = 0;
      local_b8.fds_bits[0xf] = 0;
      local_b8.fds_bits[0xc] = 0;
      local_b8.fds_bits[0xd] = 0;
      local_b8.fds_bits[10] = 0;
      local_b8.fds_bits[0xb] = 0;
      local_b8.fds_bits[8] = 0;
      local_b8.fds_bits[9] = 0;
      local_b8.fds_bits[6] = 0;
      local_b8.fds_bits[7] = 0;
      local_b8.fds_bits[4] = 0;
      local_b8.fds_bits[5] = 0;
      local_b8.fds_bits[2] = 0;
      local_b8.fds_bits[3] = 0;
      local_b8.fds_bits[0] = 0;
      local_b8.fds_bits[1] = 0;
      local_b8.fds_bits[(uint)sock >> 6] =
           local_b8.fds_bits[(uint)sock >> 6] | 1L << ((byte)sock & 0x3f);
      select(sock + 1,(fd_set *)0x0,&local_b8,(fd_set *)0x0,(timeval *)0x0);
      sVar1 = send(sock,buf,size,0);
      if (sVar1 == -1) {
        piVar2 = __errno_location();
        if (*piVar2 != 4) {
          return -1;
        }
      }
      else {
        if (sVar1 == 0) {
          piVar2 = __errno_location();
          *piVar2 = 0x6b;
          return -1;
        }
        size = size - sVar1;
        buf = (void *)((long)buf + sVar1);
      }
    } while (size != 0);
    return 0;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/msgio.c"
                ,0x1af,"int buf_send(int, void *, size_t)");
}

Assistant:

int
buf_send(int sock, void *buf, size_t size)
{
	ssize_t done;
	unsigned char *ptr;

	PJDLOG_ASSERT(sock >= 0);
	PJDLOG_ASSERT(size > 0);
	PJDLOG_ASSERT(buf != NULL);

	ptr = buf;
	do {
		fd_wait(sock, false);
		done = send(sock, ptr, size, 0);
		if (done == -1) {
			if (errno == EINTR)
				continue;
			return (-1);
		} else if (done == 0) {
			errno = ENOTCONN;
			return (-1);
		}
		size -= done;
		ptr += done;
	} while (size > 0);

	return (0);
}